

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O0

optional<float> __thiscall pbrt::TabulatedBSSRDF::SampleSr(TabulatedBSSRDF *this,Float u)

{
  optional<float> in_RDI;
  Float FVar1;
  Float in_stack_00000158;
  Float in_stack_0000015c;
  undefined1 in_stack_00000160 [16];
  undefined1 in_stack_00000170 [16];
  undefined1 in_stack_00000180 [16];
  undefined1 in_stack_000001a0 [16];
  Float *in_stack_000001b0;
  Float *in_stack_000001b8;
  undefined8 in_stack_ffffffffffffff68;
  int i;
  SampledSpectrum *in_stack_ffffffffffffff70;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_ffffffffffffff78;
  span<const_float> *in_stack_ffffffffffffff80;
  undefined8 local_58;
  undefined8 local_50;
  
  i = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  FVar1 = SampledSpectrum::operator[](in_stack_ffffffffffffff70,i);
  if ((FVar1 != 0.0) || (NAN(FVar1))) {
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    pstd::span<float_const>::
    span<pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>,void,pstd::vector<float,pstd::pmr::polymorphic_allocator<float>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    SampledSpectrum::operator[](in_stack_ffffffffffffff70,i);
    SampleCatmullRom2D((span<const_float>)in_stack_00000180,(span<const_float>)in_stack_00000170,
                       (span<const_float>)in_stack_00000160,(span<const_float>)in_stack_000001a0,
                       in_stack_0000015c,in_stack_00000158,in_stack_000001b0,in_stack_000001b8);
    SampledSpectrum::operator[]((SampledSpectrum *)local_50,(int)((ulong)local_58 >> 0x20));
    pstd::optional<float>::optional(local_50,local_58);
  }
  else {
    memset((void *)in_RDI,0,8);
    pstd::optional<float>::optional((optional<float> *)in_RDI);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Float> SampleSr(Float u) const {
        if (sigma_t[0] == 0)
            return {};
        return SampleCatmullRom2D(table->rhoSamples, table->radiusSamples, table->profile,
                                  table->profileCDF, rho[0], u) /
               sigma_t[0];
    }